

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::erase
          (QPodArrayOps<Qt::DayOfWeek> *this,DayOfWeek *b,qsizetype n)

{
  DayOfWeek *__src;
  QArrayDataPointer<Qt::DayOfWeek> *pQVar1;
  DayOfWeek *pDVar2;
  long in_RDX;
  QArrayDataPointer<Qt::DayOfWeek> *in_RSI;
  long in_RDI;
  DayOfWeek *e;
  QArrayDataPointer<Qt::DayOfWeek> *in_stack_ffffffffffffffb0;
  
  __src = (DayOfWeek *)((long)&in_RSI->d + in_RDX * 4);
  pQVar1 = (QArrayDataPointer<Qt::DayOfWeek> *)
           QArrayDataPointer<Qt::DayOfWeek>::begin((QArrayDataPointer<Qt::DayOfWeek> *)0x4f3976);
  if ((in_RSI == pQVar1) &&
     (pDVar2 = QArrayDataPointer<Qt::DayOfWeek>::end(in_stack_ffffffffffffffb0), __src != pDVar2)) {
    *(DayOfWeek **)(in_RDI + 8) = __src;
  }
  else {
    pDVar2 = QArrayDataPointer<Qt::DayOfWeek>::end(in_stack_ffffffffffffffb0);
    if (__src != pDVar2) {
      pDVar2 = QArrayDataPointer<Qt::DayOfWeek>::end(in_RSI);
      memmove(in_RSI,__src,((long)pDVar2 - (long)__src >> 2) << 2);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }